

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

Error __thiscall asmjit::BaseEmitter::onDetach(BaseEmitter *this,CodeHolder *code)

{
  byte bVar1;
  
  bVar1 = this->_emitterFlags;
  if ((bVar1 & 0x10) == 0) {
    this->_logger = (Logger *)0x0;
  }
  if ((bVar1 & 0x20) == 0) {
    this->_errorHandler = (ErrorHandler *)0x0;
  }
  this->_emitterFlags = bVar1 & 0x30;
  this->_forcedInstOptions = 1;
  this->_privateData = 0;
  (this->_environment)._arch = '\0';
  (this->_environment)._subArch = '\0';
  (this->_environment)._vendor = '\0';
  (this->_environment)._platform = '\0';
  (this->_environment)._abi = '\0';
  (this->_environment)._format = '\0';
  (this->_environment)._reserved = 0;
  this->_gpRegInfo = 0;
  this->_instOptions = 0;
  (this->_extraReg)._signature = 0;
  (this->_extraReg)._id = 0;
  this->_inlineComment = (char *)0x0;
  return 0;
}

Assistant:

inline bool hasEmitterFlag(uint32_t flag) const noexcept { return (_emitterFlags & flag) != 0; }